

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O1

char * __thiscall QTableModel::index(QTableModel *this,char *__s,int __c)

{
  long lVar1;
  long *plVar2;
  int iVar3;
  undefined4 in_register_00000014;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  lVar4 = CONCAT44(in_register_00000014,__c);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (lVar4 == 0) {
LAB_0059db42:
    *(undefined8 *)this = 0xffffffffffffffff;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      *(undefined8 *)&this->field_0x8 = 0;
      this->prototype = (QTableWidgetItem *)0x0;
      return (char *)this;
    }
  }
  else {
    uVar6 = (ulong)*(int *)(*(long *)(lVar4 + 0x30) + 8);
    if ((((long)uVar6 < 0) || (*(ulong *)(__s + 0x28) <= uVar6)) ||
       (*(long *)(*(long *)(__s + 0x20) + uVar6 * 8) != lVar4)) {
      if (*(long *)(__s + 0x28) == 0) {
LAB_0059daa3:
        uVar6 = 0xffffffffffffffff;
      }
      else {
        uVar5 = 0xfffffffffffffff8;
        do {
          lVar1 = *(long *)(__s + 0x28) * -8 + uVar5;
          if (lVar1 == -8) goto LAB_0059da9d;
          uVar6 = uVar5 + 8;
          plVar2 = (long *)(*(long *)(__s + 0x20) + 8 + uVar5);
          uVar5 = uVar6;
        } while (*plVar2 != lVar4);
        uVar6 = (long)uVar6 >> 3;
LAB_0059da9d:
        if (lVar1 == -8) goto LAB_0059daa3;
      }
      if ((int)uVar6 == -1) goto LAB_0059db42;
    }
    local_50 = 0xffffffffffffffff;
    local_48 = 0;
    uStack_40 = 0;
    iVar3 = (**(code **)(*(long *)__s + 0x80))(__s,&local_50);
    uVar6 = (ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff;
    local_50 = 0xffffffffffffffff;
    local_48 = 0;
    uStack_40 = 0;
    (**(code **)(*(long *)__s + 0x80))(__s,&local_50,(long)uVar6 % (long)iVar3 & 0xffffffff);
    local_50 = 0xffffffffffffffff;
    local_48 = 0;
    uStack_40 = 0;
    QAbstractTableModel::index
              ((int)this,(int)__s,(QModelIndex *)((long)uVar6 / (long)iVar3 & 0xffffffff));
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return (char *)this;
    }
  }
  __stack_chk_fail();
}

Assistant:

QModelIndex QTableModel::index(const QTableWidgetItem *item) const
{
    if (!item)
        return QModelIndex();
    int i = -1;
    const int id = item->d->id;
    if (id >= 0 && id < tableItems.size() && tableItems.at(id) == item) {
        i = id;
    } else { // we need to search for the item
        i = tableItems.indexOf(const_cast<QTableWidgetItem*>(item));
        if (i == -1) // not found
            return QModelIndex();
    }
    int row = i / columnCount();
    int col = i % columnCount();
    return QAbstractTableModel::index(row, col);
}